

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O0

void Shell::Shuffling::shuffleArray<Lib::DArray<Lib::List<Kernel::Unit*>*>>
               (DArray<Lib::List<Kernel::Unit_*>_*> *a,uint len)

{
  int iVar1;
  List<Kernel::Unit_*> **__b;
  uint in_ESI;
  DArray<Lib::List<Kernel::Unit_*>_*> *in_RDI;
  uint j;
  uint i;
  List<Kernel::Unit_*> **in_stack_ffffffffffffffe0;
  undefined4 local_10;
  
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    iVar1 = Lib::Random::getInteger((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    in_stack_ffffffffffffffe0 =
         Lib::DArray<Lib::List<Kernel::Unit_*>_*>::operator[](in_RDI,(ulong)local_10);
    __b = Lib::DArray<Lib::List<Kernel::Unit_*>_*>::operator[](in_RDI,(ulong)(iVar1 + local_10));
    std::swap<Lib::List<Kernel::Unit*>*>(in_stack_ffffffffffffffe0,__b);
  }
  return;
}

Assistant:

static void shuffleArray(Arrayish& a, unsigned len) {
    for(unsigned i=0;i<len;i++){
      unsigned j = Random::getInteger(len-i)+i;
      std::swap(a[i],a[j]);
    }
  }